

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O3

void __thiscall
gl4cts::ClearOpsBufferStorageTestCase::deinitTestCaseGlobal(ClearOpsBufferStorageTestCase *this)

{
  if (this->m_helper_bo != 0) {
    (*this->m_gl->deleteBuffers)(1,&this->m_helper_bo);
    this->m_helper_bo = 0;
  }
  if (this->m_initial_data != (uchar *)0x0) {
    operator_delete__(this->m_initial_data);
    this->m_initial_data = (uchar *)0x0;
  }
  return;
}

Assistant:

void ClearOpsBufferStorageTestCase::deinitTestCaseGlobal()
{
	if (m_helper_bo != 0)
	{
		m_gl.deleteBuffers(1, &m_helper_bo);

		m_helper_bo = 0;
	}

	if (m_initial_data != DE_NULL)
	{
		delete[] m_initial_data;

		m_initial_data = DE_NULL;
	}
}